

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryShaderRenderTest::compare
          (GeometryShaderRenderTest *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  RenderTarget *this_00;
  TestLog *pTVar5;
  int *piVar6;
  MessageBuilder *pMVar7;
  RGBA *local_908;
  MessageBuilder local_8a8;
  allocator<char> local_721;
  string local_720;
  allocator<char> local_6f9;
  string local_6f8;
  LogImage local_6d8;
  allocator<char> local_641;
  string local_640;
  allocator<char> local_619;
  string local_618;
  LogImage local_5f8;
  allocator<char> local_561;
  string local_560;
  allocator<char> local_539;
  string local_538;
  LogImage local_518;
  allocator<char> local_481;
  string local_480;
  allocator<char> local_459;
  string local_458;
  LogImageSet local_438;
  MessageBuilder local_3f8;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  LogImage local_228;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  LogImageSet local_148;
  deUint32 local_108;
  int local_104;
  int maxColDiff;
  Vector<int,_4> local_f0;
  Vector<int,_4> local_e0;
  undefined1 local_d0 [8];
  IVec4 colDiff;
  RGBA testColor;
  int dy;
  int dx;
  bool found;
  RGBA refcolor;
  int local_a4;
  int y;
  int x;
  bool testResult;
  int colorComponentThreshold;
  RGBA red;
  RGBA local_84;
  undefined1 local_80 [4];
  RGBA green;
  Surface errorMask;
  ConstPixelBufferAccess local_40;
  GeometryShaderRenderTest *local_18;
  GeometryShaderRenderTest *this_local;
  
  local_18 = this;
  this_00 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = tcu::RenderTarget::getNumSamples(this_00);
  if (iVar3 < 2) {
    piVar6 = tcu::Vector<int,_2>::x(&this->m_viewportSize);
    iVar3 = *piVar6;
    piVar6 = tcu::Vector<int,_2>::y(&this->m_viewportSize);
    tcu::Surface::Surface((Surface *)local_80,iVar3,*piVar6);
    tcu::RGBA::RGBA(&local_84,0,0xff,0,0xff);
    tcu::RGBA::RGBA((RGBA *)&stack0xffffffffffffff68,0xff,0,0,0xff);
    bVar1 = 1;
    for (local_a4 = 0; piVar6 = tcu::Vector<int,_2>::x(&this->m_viewportSize), local_a4 < *piVar6;
        local_a4 = local_a4 + 1) {
      for (refcolor.m_value = 0; piVar6 = tcu::Vector<int,_2>::y(&this->m_viewportSize),
          (int)refcolor.m_value < *piVar6; refcolor.m_value = refcolor.m_value + 1) {
        if ((((local_a4 == 0) || (refcolor.m_value == 0)) ||
            (piVar6 = tcu::Vector<int,_2>::x(&this->m_viewportSize), local_a4 + 1 == *piVar6)) ||
           (piVar6 = tcu::Vector<int,_2>::y(&this->m_viewportSize), refcolor.m_value + 1 == *piVar6)
           ) {
          tcu::Surface::setPixel((Surface *)local_80,local_a4,refcolor.m_value,local_84);
        }
        else {
          tcu::Surface::getPixel(this->m_refResult,local_a4,refcolor.m_value);
          bVar2 = false;
          for (testColor.m_value = 0xffffffff; (int)testColor.m_value < 2;
              testColor.m_value = testColor.m_value + 1) {
            for (colDiff.m_data[3] = -1; colDiff.m_data[3] < 2;
                colDiff.m_data[3] = colDiff.m_data[3] + 1) {
              colDiff.m_data[2] =
                   (int)tcu::Surface::getPixel
                                  (this->m_glResult,local_a4 + testColor.m_value,
                                   refcolor.m_value + colDiff.m_data[3]);
              tcu::RGBA::toIVec((RGBA *)&local_f0);
              tcu::RGBA::toIVec((RGBA *)&stack0xffffffffffffff00);
              tcu::operator-((tcu *)&local_e0,&local_f0,(Vector<int,_4> *)&stack0xffffffffffffff00);
              tcu::abs<int,4>((tcu *)local_d0,&local_e0);
              iVar3 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_d0);
              iVar4 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_d0);
              iVar3 = de::max<int>(iVar3,iVar4);
              iVar4 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_d0);
              local_104 = de::max<int>(iVar3,iVar4);
              if (local_104 < 0x15) {
                bVar2 = true;
              }
            }
          }
          if (bVar2) {
            local_908 = &local_84;
          }
          else {
            bVar1 = 0;
            local_908 = (RGBA *)&stack0xffffffffffffff68;
          }
          local_108 = local_908->m_value;
          tcu::Surface::setPixel((Surface *)local_80,local_a4,refcolor.m_value,(RGBA)local_108);
        }
      }
    }
    if (bVar1 == 0) {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_458,"Compare result",&local_459);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_480,"Result of rendering",&local_481);
      tcu::LogImageSet::LogImageSet(&local_438,&local_458,&local_480);
      pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_438);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_538,"Result",&local_539);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_560,"Result",&local_561);
      tcu::LogImage::LogImage
                (&local_518,&local_538,&local_560,this->m_glResult,QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_518);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_618,"Reference",&local_619);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_640,"Reference",&local_641);
      tcu::LogImage::LogImage
                (&local_5f8,&local_618,&local_640,this->m_refResult,QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_5f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6f8,"ErrorMask",&local_6f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_720,"Error mask",&local_721);
      tcu::LogImage::LogImage
                (&local_6d8,&local_6f8,&local_720,(Surface *)local_80,QP_IMAGE_COMPRESSION_MODE_BEST
                );
      pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_6d8);
      tcu::TestLog::operator<<(pTVar5,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
      tcu::LogImage::~LogImage(&local_6d8);
      std::__cxx11::string::~string((string *)&local_720);
      std::allocator<char>::~allocator(&local_721);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::allocator<char>::~allocator(&local_6f9);
      tcu::LogImage::~LogImage(&local_5f8);
      std::__cxx11::string::~string((string *)&local_640);
      std::allocator<char>::~allocator(&local_641);
      std::__cxx11::string::~string((string *)&local_618);
      std::allocator<char>::~allocator(&local_619);
      tcu::LogImage::~LogImage(&local_518);
      std::__cxx11::string::~string((string *)&local_560);
      std::allocator<char>::~allocator(&local_561);
      std::__cxx11::string::~string((string *)&local_538);
      std::allocator<char>::~allocator(&local_539);
      tcu::LogImageSet::~LogImageSet(&local_438);
      std::__cxx11::string::~string((string *)&local_480);
      std::allocator<char>::~allocator(&local_481);
      std::__cxx11::string::~string((string *)&local_458);
      std::allocator<char>::~allocator(&local_459);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_8a8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<(&local_8a8,(char (*) [22])"Image compare failed.");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_8a8);
    }
    else {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,"Compare result",&local_169);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,"Result of rendering",&local_191);
      tcu::LogImageSet::LogImageSet(&local_148,&local_168,&local_190);
      pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_148);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"Result",&local_249);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"Result",&local_271);
      tcu::LogImage::LogImage
                (&local_228,&local_248,&local_270,this->m_glResult,QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_228);
      tcu::TestLog::operator<<(pTVar5,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
      tcu::LogImage::~LogImage(&local_228);
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator(&local_271);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator(&local_249);
      tcu::LogImageSet::~LogImageSet(&local_148);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator(&local_191);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_3f8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<(&local_3f8,(char (*) [18])"Image compare ok.");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3f8);
    }
    this_local._7_1_ = bVar1;
    tcu::Surface::~Surface((Surface *)local_80);
  }
  else {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_40,this->m_refResult);
    tcu::Surface::getAccess((PixelBufferAccess *)&errorMask.m_pixels.m_cap,this->m_glResult);
    this_local._7_1_ =
         tcu::fuzzyCompare(pTVar5,"Compare Results","Compare Results",&local_40,
                           (ConstPixelBufferAccess *)&errorMask.m_pixels.m_cap,0.02,
                           COMPARE_LOG_RESULT);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool GeometryShaderRenderTest::compare (void)
{
	using tcu::TestLog;

	if (m_context.getRenderTarget().getNumSamples() > 1)
	{
		return tcu::fuzzyCompare(m_testCtx.getLog(), "Compare Results", "Compare Results", m_refResult->getAccess(), m_glResult->getAccess(), 0.02f, tcu::COMPARE_LOG_RESULT);
	}
	else
	{
		tcu::Surface	errorMask				(m_viewportSize.x(), m_viewportSize.y());
		const tcu::RGBA	green					(0, 255, 0, 255);
		const tcu::RGBA	red						(255, 0, 0, 255);
		const int		colorComponentThreshold	= 20;
		bool			testResult				= true;

		for (int x = 0; x < m_viewportSize.x(); ++x)
		for (int y = 0; y < m_viewportSize.y(); ++y)
		{
			if (x == 0 || y == 0 || x + 1 == m_viewportSize.x() || y + 1 == m_viewportSize.y())
			{
				// Mark edge pixels as correct since their neighbourhood is undefined
				errorMask.setPixel(x, y, green);
			}
			else
			{
				const tcu::RGBA	refcolor	= m_refResult->getPixel(x, y);
				bool			found		= false;

				// Got to find similar pixel near this pixel (3x3 kernel)
				for (int dx = -1; dx <= 1; ++dx)
				for (int dy = -1; dy <= 1; ++dy)
				{
					const tcu::RGBA		testColor	= m_glResult->getPixel(x + dx, y + dy);
					const tcu::IVec4	colDiff		= tcu::abs(testColor.toIVec() - refcolor.toIVec());

					const int			maxColDiff	= de::max(de::max(colDiff.x(), colDiff.y()), colDiff.z()); // check RGB channels

					if (maxColDiff <= colorComponentThreshold)
						found = true;
				}

				if (!found)
					testResult = false;

				errorMask.setPixel(x, y, (found) ? (green) : (red));
			}
		}

		if (testResult)
		{
			m_testCtx.getLog()	<< TestLog::ImageSet("Compare result", "Result of rendering")
								<< TestLog::Image("Result", "Result", *m_glResult)
								<< TestLog::EndImageSet;
			m_testCtx.getLog() << TestLog::Message << "Image compare ok." << TestLog::EndMessage;
		}
		else
		{
			m_testCtx.getLog()	<< TestLog::ImageSet("Compare result", "Result of rendering")
								<< TestLog::Image("Result",		"Result",		*m_glResult)
								<< TestLog::Image("Reference",	"Reference",	*m_refResult)
								<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
								<< TestLog::EndImageSet;
			m_testCtx.getLog() << TestLog::Message << "Image compare failed." << TestLog::EndMessage;
		}

		return testResult;
	}
}